

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::StructuredAssignmentPatternExpression::forFixedArray
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  char *pcVar1;
  undefined4 uVar2;
  SyntaxNode *this;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  bool bVar5;
  int iVar6;
  AssignmentPatternItemSyntax *pAVar7;
  Expression *defaultSetter_00;
  undefined4 extraout_var;
  Expression *pEVar8;
  optional<int> oVar9;
  Diagnostic *this_00;
  ConstantRange CVar10;
  ConstantRange CVar11;
  ulong uVar12;
  long lVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  StructuredAssignmentPatternExpression *expr;
  StructuredAssignmentPatternExpression *pSVar14;
  EVP_PKEY_CTX *extraout_RDX;
  ulong uVar15;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  byte bVar16;
  StructuredAssignmentPatternExpression *ctx;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  SourceRange SVar26;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd58;
  TypeSetter local_290;
  StructuredAssignmentPatternExpression *local_280;
  Type *local_278;
  Expression *defaultSetter;
  span<const_slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
  local_268;
  StructuredAssignmentPatternSyntax *local_250;
  ulong local_248;
  SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *local_240;
  span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  local_238;
  span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  local_228;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_160;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_4UL> indexSetters;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  indexMap;
  
  defaultSetter = (Expression *)0x0;
  local_280 = (StructuredAssignmentPatternExpression *)type;
  local_278 = elementType;
  SmallMap<int,_const_slang::ast::Expression_*,_8UL,_std::pair<const_int,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::SmallMap(&indexMap);
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .data_ = (pointer)indexSetters.
                    super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                    .firstElement;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .len = 0;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  data_ = (pointer)typeSetters.
                   super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                   .firstElement;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  len = 0;
  local_240 = &syntax->items;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  indexSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
  .cap = 4;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  cap = 4;
  local_248 = (syntax->items).elements._M_extent._M_extent_value + 1 >> 1;
  defaultSetter_00 = (Expression *)0x0;
  bVar16 = 0;
  local_250 = syntax;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)local_240;
  for (; ((SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax> *)
          elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ != local_240 ||
         (elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len != local_248));
      elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
           elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
    pAVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::
             iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>::dereference
                       ((iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*> *)
                        &elements);
    this = &((pAVar7->key).ptr)->super_SyntaxNode;
    if (this->kind == DefaultPatternKeyExpression) {
      if (defaultSetter_00 != (Expression *)0x0) {
        SVar26 = slang::syntax::SyntaxNode::sourceRange(this);
        bVar16 = 1;
        ASTContext::addDiag(context,(DiagCode)0xf0007,SVar26);
      }
      defaultSetter_00 =
           Expression::selfDetermined
                     (comp,(pAVar7->expr).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0);
      defaultSetter = defaultSetter_00;
      bVar5 = Expression::bad(defaultSetter_00);
LAB_003ac871:
      bVar24 = bVar16 | bVar5;
    }
    else {
      iVar6 = Expression::bind((int)this,(sockaddr *)context,4);
      pEVar8 = (Expression *)CONCAT44(extraout_var,iVar6);
      bVar5 = Expression::bad(pEVar8);
      bVar18 = 1;
      bVar24 = bVar18;
      if (!bVar5) {
        if (pEVar8->kind == DataType) {
          CVar11 = (ConstantRange)(pEVar8->type).ptr;
          bVar5 = Type::isSimpleType((Type *)CVar11);
          if (bVar5) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = context;
            pEVar8 = Expression::bindRValue
                               ((Expression *)CVar11,(Type *)(pAVar7->expr).ptr,
                                (ExpressionSyntax *)0x0,(SourceRange)(auVar4 << 0x40),
                                (ASTContext *)0x0,in_stack_fffffffffffffd58);
            local_290.type.ptr = (Type *)CVar11;
            local_290.expr.ptr = pEVar8;
            SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
            emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      (&typeSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                       ,&local_290);
            bVar5 = Expression::bad(pEVar8);
            goto LAB_003ac871;
          }
          SVar26 = slang::syntax::SyntaxNode::sourceRange(&((pAVar7->key).ptr)->super_SyntaxNode);
          ASTContext::addDiag(context,(DiagCode)0x120007,SVar26);
        }
        else {
          oVar9 = bindArrayIndexSetter
                            (context,pEVar8,local_278,(pAVar7->expr).ptr,&indexMap,
                             &indexSetters.
                              super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                            );
          if (((ulong)oVar9.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
            local_290.type.ptr = (Type *)Type::getFixedRange((Type *)local_280);
            bVar5 = ConstantRange::containsPoint
                              ((ConstantRange *)&local_290,
                               oVar9.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>._M_payload);
            bVar24 = bVar16;
            if (!bVar5) {
              this_00 = ASTContext::addDiag(context,(DiagCode)0x5c0007,pEVar8->sourceRange);
              Diagnostic::operator<<<int>
                        (this_00,oVar9.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>._M_payload);
              ast::operator<<(this_00,(Type *)local_280);
              bVar24 = bVar18;
            }
          }
        }
      }
    }
    bVar16 = bVar24;
  }
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  local_290.expr.ptr = local_290.expr.ptr & 0xffffffffffffff00;
  CVar10 = Type::getFixedRange((Type *)local_280);
  iVar6 = CVar10.left;
  CVar11 = (ConstantRange)((ulong)CVar10 >> 0x20);
  if (CVar10.right < iVar6) {
    CVar11 = CVar10;
  }
  uVar20 = (long)CVar10 >> 0x20;
  if ((long)iVar6 < (long)CVar10 >> 0x20) {
    uVar20 = (long)iVar6;
  }
  src = extraout_RDX;
  do {
    if ((long)CVar11.left < (long)uVar20) {
LAB_003acb8e:
      local_268._M_ptr = (pointer)0x0;
      local_268._M_extent._M_extent_value = 0;
      iVar6 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                        (&typeSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                         ,(EVP_PKEY_CTX *)comp,src);
      local_228._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar6);
      iVar6 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::copy
                        (&indexSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                         ,(EVP_PKEY_CTX *)comp,src_00);
      local_238._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar6);
      iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                         (EVP_PKEY_CTX *)comp,src_01);
      local_160._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar6);
      ctx = local_280;
      expr = BumpAllocator::
             emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter_const,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                       (&comp->super_BumpAllocator,(Type *)local_280,&local_268,&local_228,
                        &local_238,&defaultSetter,&local_160,&sourceRange);
      pSVar14 = expr;
      if (bVar16 != 0) {
        pSVar14 = (StructuredAssignmentPatternExpression *)
                  Expression::badExpr(comp,(Expression *)expr);
        ctx = expr;
      }
      SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)ctx
                );
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::cleanup
                (&typeSetters.
                  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                 ,(EVP_PKEY_CTX *)ctx);
      SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>::cleanup
                (&indexSetters.
                  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::IndexSetter>
                 ,(EVP_PKEY_CTX *)ctx);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<int,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<int,_void>,_std::equal_to<int>,_slang::detail::hashing::StackAllocator<std::pair<const_int,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                     *)&indexMap.super_Storage.field_0x88);
      return (Expression *)pSVar14;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar20;
    uVar15 = SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = uVar15 >> (indexMap._144_1_ & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar15 & 0xff];
    uVar17 = 0;
    do {
      pcVar1 = (char *)(indexMap._160_8_ + uVar12 * 0x10);
      cVar21 = (char)uVar2;
      auVar25[0] = -(*pcVar1 == cVar21);
      cVar22 = (char)((uint)uVar2 >> 8);
      auVar25[1] = -(pcVar1[1] == cVar22);
      cVar23 = (char)((uint)uVar2 >> 0x10);
      auVar25[2] = -(pcVar1[2] == cVar23);
      bVar24 = (byte)((uint)uVar2 >> 0x18);
      auVar25[3] = -(pcVar1[3] == bVar24);
      auVar25[4] = -(pcVar1[4] == cVar21);
      auVar25[5] = -(pcVar1[5] == cVar22);
      auVar25[6] = -(pcVar1[6] == cVar23);
      auVar25[7] = -(pcVar1[7] == bVar24);
      auVar25[8] = -(pcVar1[8] == cVar21);
      auVar25[9] = -(pcVar1[9] == cVar22);
      auVar25[10] = -(pcVar1[10] == cVar23);
      auVar25[0xb] = -(pcVar1[0xb] == bVar24);
      auVar25[0xc] = -(pcVar1[0xc] == cVar21);
      auVar25[0xd] = -(pcVar1[0xd] == cVar22);
      auVar25[0xe] = -(pcVar1[0xe] == cVar23);
      auVar25[0xf] = -(pcVar1[0xf] == bVar24);
      uVar19 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
      if (uVar19 != 0) {
        lVar13 = indexMap._168_8_ + uVar12 * 0xf0;
        do {
          iVar6 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
            }
          }
          if (*(int *)(lVar13 + (ulong)(uint)(iVar6 << 4)) == (int)uVar20) {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                       (Expression **)(lVar13 + (ulong)(uint)(iVar6 << 4) + 8));
            src = extraout_RDX_01;
            goto LAB_003acb84;
          }
          uVar19 = uVar19 - 1 & uVar19;
        } while (uVar19 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & pcVar1[0xf]) == 0) break;
      lVar13 = uVar12 + uVar17;
      uVar17 = uVar17 + 1;
      uVar12 = lVar13 + 1U & indexMap._152_8_;
    } while (uVar17 <= (ulong)indexMap._152_8_);
    if ((char)local_290.expr.ptr == '\0') {
      SVar26 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_250);
      typeSetters_00._M_extent._M_extent_value =
           typeSetters.
           super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.len;
      typeSetters_00._M_ptr =
           typeSetters.
           super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
           data_;
      local_290.type.ptr =
           (Type *)matchElementValue(context,local_278,(FieldSymbol *)0x0,SVar26,typeSetters_00,
                                     defaultSetter_00);
      local_290.expr.ptr._1_4_ = local_268._M_ptr._0_4_;
      src = (EVP_PKEY_CTX *)(ulong)local_268._M_ptr._3_4_;
      local_290.expr.ptr._5_3_ = local_268._M_ptr._4_3_;
      local_290.expr.ptr._0_1_ = 1;
      if ((ConstantRange)local_290.type.ptr == (ConstantRange)0x0) {
        bVar16 = 1;
        goto LAB_003acb8e;
      }
    }
    SmallVectorBase<slang::ast::Expression_const*>::
    emplace_back<slang::ast::Expression_const*const&>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,(Expression **)&local_290
              );
    src = extraout_RDX_00;
LAB_003acb84:
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forFixedArray(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<int32_t, const Expression*, 8> indexMap;
    SmallVector<IndexSetter, 4> indexSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
            continue;
        }

        // The key is either an array index or a data type setter.
        auto& keyExpr = Expression::bind(*item->key, context, ASTFlags::AllowDataType);
        if (keyExpr.bad()) {
            bad = true;
            continue;
        }

        if (keyExpr.kind == ExpressionKind::DataType) {
            const Type& typeKey = *keyExpr.type;
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            auto index = bindArrayIndexSetter(context, keyExpr, elementType, *item->expr, indexMap,
                                              indexSetters);
            if (!index) {
                bad = true;
                continue;
            }

            if (!type.getFixedRange().containsPoint(*index)) {
                auto& diag = context.addDiag(diag::IndexValueInvalid, keyExpr.sourceRange);
                diag << *index;
                diag << type;
                bad = true;
            }
        }
    }

    SmallVector<const Expression*> elements;
    std::optional<const Expression*> cachedVal;
    auto arrayRange = type.getFixedRange();

    for (int32_t i = arrayRange.lower(); i <= arrayRange.upper(); i++) {
        // If we already have a setter for this index we don't have to do anything else.
        if (auto it = indexMap.find(i); it != indexMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        if (!cachedVal) {
            cachedVal = matchElementValue(context, elementType, nullptr, syntax.sourceRange(),
                                          typeSetters, defaultSetter);
            if (!cachedVal.value()) {
                bad = true;
                break;
            }
        }

        elements.push_back(*cachedVal);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, std::span<const MemberSetter>{}, typeSetters.copy(comp), indexSetters.copy(comp),
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}